

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LookaheadDFA.hpp
# Opt level: O3

void __thiscall
Centaurus::LookaheadDFA<wchar_t>::LookaheadDFA
          (LookaheadDFA<wchar_t> *this,CompositeATN<wchar_t> *catn,ATNPath *origin,
          bool optimize_flag)

{
  NFABaseState<wchar_t,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
  *pNVar1;
  vector<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_> *__range2;
  LDFAState<wchar_t> *state;
  NFABaseState<wchar_t,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
  *this_00;
  _Rb_tree<Centaurus::CATNClosureElement,_Centaurus::CATNClosureElement,_std::_Identity<Centaurus::CATNClosureElement>,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>
  _Stack_58;
  
  (this->super_NFABase<Centaurus::LDFAState<wchar_t>_>).m_states.
  super__Vector_base<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_NFABase<Centaurus::LDFAState<wchar_t>_>).m_states.
  super__Vector_base<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_NFABase<Centaurus::LDFAState<wchar_t>_>).m_states.
  super__Vector_base<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_NFABase<Centaurus::LDFAState<wchar_t>_>)._vptr_NFABase =
       (_func_int **)&PTR__NFABase_0019d2a0;
  CompositeATN<wchar_t>::build_root_closure((CATNClosure *)&_Stack_58,catn,origin);
  std::vector<Centaurus::LDFAState<wchar_t>,std::allocator<Centaurus::LDFAState<wchar_t>>>::
  emplace_back<std::set<Centaurus::CATNClosureElement,std::less<Centaurus::CATNClosureElement>,std::allocator<Centaurus::CATNClosureElement>>>
            ((vector<Centaurus::LDFAState<wchar_t>,std::allocator<Centaurus::LDFAState<wchar_t>>> *)
             &(this->super_NFABase<Centaurus::LDFAState<wchar_t>_>).m_states,
             (set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>
              *)&_Stack_58);
  std::
  _Rb_tree<Centaurus::CATNClosureElement,_Centaurus::CATNClosureElement,_std::_Identity<Centaurus::CATNClosureElement>,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>
  ::~_Rb_tree(&_Stack_58);
  fork_closures(this,catn,0);
  pNVar1 = &((this->super_NFABase<Centaurus::LDFAState<wchar_t>_>).m_states.
             super__Vector_base<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super_NFABaseState<wchar_t,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
  ;
  for (this_00 = &((this->super_NFABase<Centaurus::LDFAState<wchar_t>_>).m_states.
                   super__Vector_base<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                  super_NFABaseState<wchar_t,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
      ; this_00 != pNVar1; this_00 = this_00 + 1) {
    NFABaseState<wchar_t,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
    ::sort(this_00);
  }
  if (optimize_flag) {
    minimize(this);
  }
  return;
}

Assistant:

LookaheadDFA(const CompositeATN<TCHAR>& catn, const ATNPath& origin, bool optimize_flag = true)
	{
		m_states.emplace_back(catn.build_root_closure(origin));

		fork_closures(catn, 0);

        for (auto& state : m_states)
            state.sort();

        if (optimize_flag)
            minimize();
	}